

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long mkvparser::AudioTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               AudioTrack **pResult)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  int iVar3;
  long lVar4;
  longlong lVar5;
  longlong lVar6;
  AudioTrack *pAVar7;
  long lVar8;
  longlong pos;
  longlong size;
  double rate;
  longlong id;
  longlong local_88;
  longlong local_80;
  double local_78;
  longlong local_70;
  double local_68;
  AudioTrack **local_60;
  Segment *local_58;
  longlong local_50;
  longlong local_48;
  Info *local_40;
  long local_38;
  
  lVar8 = -1;
  if ((*pResult == (AudioTrack *)0x0) && (info->type == 2)) {
    local_88 = (info->settings).start;
    if (local_88 < 0) {
      __assert_fail("s.start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x15c3,
                    "static long mkvparser::AudioTrack::Parse(Segment *, const Info &, long long, long long, AudioTrack *&)"
                   );
    }
    lVar8 = (info->settings).size;
    local_60 = pResult;
    local_50 = element_start;
    local_48 = element_size;
    local_40 = info;
    if (lVar8 < 0) {
      __assert_fail("s.size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x15c4,
                    "static long mkvparser::AudioTrack::Parse(Segment *, const Info &, long long, long long, AudioTrack *&)"
                   );
    }
    pReader = pSegment->m_pReader;
    lVar8 = lVar8 + local_88;
    local_68 = 8000.0;
    local_70 = 1;
    local_78 = 8000.0;
    lVar5 = 0;
    local_58 = pSegment;
    do {
      if (lVar8 <= local_88) {
        if (local_88 != lVar8) {
          return -2;
        }
        pAVar7 = (AudioTrack *)operator_new(0xd8,(nothrow_t *)&std::nothrow);
        if (pAVar7 == (AudioTrack *)0x0) {
          return -1;
        }
        (pAVar7->super_Track).m_pSegment = local_58;
        (pAVar7->super_Track).m_element_start = local_50;
        (pAVar7->super_Track).m_element_size = local_48;
        (pAVar7->super_Track).m_info.uid = 0;
        (pAVar7->super_Track).m_info.defaultDuration = 0;
        (pAVar7->super_Track).m_info.codecDelay = 0;
        (pAVar7->super_Track).m_info.seekPreRoll = 0;
        (pAVar7->super_Track).m_info.nameAsUTF8 = (char *)0x0;
        (pAVar7->super_Track).m_info.language = (char *)0x0;
        (pAVar7->super_Track).m_info.codecId = (char *)0x0;
        (pAVar7->super_Track).m_info.codecNameAsUTF8 = (char *)0x0;
        (pAVar7->super_Track).m_info.codecPrivate = (uchar *)0x0;
        (pAVar7->super_Track).m_info.codecPrivateSize = 0;
        (pAVar7->super_Track).m_info.lacing = false;
        (pAVar7->super_Track).m_eos.super_BlockEntry.m_pCluster = (Cluster *)0x0;
        (pAVar7->super_Track).m_eos.super_BlockEntry.m_index = -0x8000000000000000;
        (pAVar7->super_Track).m_eos.super_BlockEntry._vptr_BlockEntry =
             (_func_int **)&PTR__BlockEntry_00124bc0;
        (pAVar7->super_Track).content_encoding_entries_ = (ContentEncoding **)0x0;
        (pAVar7->super_Track).content_encoding_entries_end_ = (ContentEncoding **)0x0;
        (pAVar7->super_Track)._vptr_Track = (_func_int **)&PTR__Track_00124d30;
        iVar3 = Track::Info::Copy(local_40,&(pAVar7->super_Track).m_info);
        if (iVar3 != 0) {
          (*(pAVar7->super_Track)._vptr_Track[1])(pAVar7);
          return -1;
        }
        pAVar7->m_rate = local_78;
        pAVar7->m_channels = local_70;
        pAVar7->m_bitDepth = lVar5;
        *local_60 = pAVar7;
        return 0;
      }
      lVar4 = ParseElementHeader(pReader,&local_88,lVar8,&local_38,&local_80);
      lVar2 = local_80;
      lVar1 = local_88;
      if (lVar4 < 0) {
        return lVar4;
      }
      if (local_38 == 0x9f) {
        local_70 = UnserializeUInt(pReader,local_88,local_80);
        lVar6 = local_70;
joined_r0x00118fe5:
        if (lVar6 < 1) break;
      }
      else if (local_38 == 0xb5) {
        lVar4 = UnserializeFloat(pReader,local_88,local_80,&local_68);
        if (lVar4 < 0) {
          return lVar4;
        }
        local_78 = local_68;
        if (local_68 <= 0.0) break;
      }
      else if (local_38 == 0x6264) {
        lVar5 = UnserializeUInt(pReader,local_88,local_80);
        lVar6 = lVar5;
        goto joined_r0x00118fe5;
      }
      local_88 = lVar1 + lVar2;
    } while (local_88 <= lVar8);
    lVar8 = -2;
  }
  return lVar8;
}

Assistant:

long AudioTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       AudioTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kAudio)
    return -1;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  double rate = 8000.0;  // MKV default
  long long channels = 1;
  long long bit_depth = 0;

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvSamplingFrequency) {
      status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvChannels) {
      channels = UnserializeUInt(pReader, pos, size);

      if (channels <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvBitDepth) {
      bit_depth = UnserializeUInt(pReader, pos, size);

      if (bit_depth <= 0)
        return E_FILE_FORMAT_INVALID;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  AudioTrack* const pTrack =
      new (std::nothrow) AudioTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {
    delete pTrack;
    return status;
  }

  pTrack->m_rate = rate;
  pTrack->m_channels = channels;
  pTrack->m_bitDepth = bit_depth;

  pResult = pTrack;
  return 0;  // success
}